

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

EVevent_list extract_events_from_queue(CManager_conflict cm,queue_ptr que,EVevent_list list)

{
  long *plVar1;
  queue_item *pqVar2;
  queue_item *pqVar3;
  event_item *event;
  CManager_conflict cm_00;
  event_item *size;
  ulong uVar4;
  
  pqVar2 = que->queue_head;
  pqVar3 = que->queue_tail;
  size = (event_item *)0x10;
  uVar4 = 0xffffffffffffffff;
  do {
    uVar4 = uVar4 + 1;
    plVar1 = (long *)((long)size + (long)&list[-1].length);
    size = (event_item *)((long)size + 0x10);
  } while (*plVar1 != -1);
  if (pqVar2 != (queue_item *)0x0) {
    while (pqVar3 != (queue_item *)0x0) {
      event = size;
      list = (EVevent_list)INT_CMrealloc(list,(size_t)size);
      cm_00 = (CManager_conflict)pqVar2->item;
      if ((*(int *)((long)&cm_00->transports + 4) == 0) && (*(long *)&cm_00->reg_format_count == 0))
      {
        encode_event(cm_00,event);
        cm_00 = (CManager_conflict)pqVar2->item;
      }
      *(undefined8 *)((long)&size->ref_count + (long)&list[-2].length) =
           *(undefined8 *)&cm_00->CManager_ID;
      *(char **)((long)&list[-2].buffer + (long)size) = cm_00->control_module_choice;
      uVar4 = uVar4 + 1;
      size = (event_item *)&size->encoded_event;
      pqVar2 = pqVar2->next;
      pqVar3 = pqVar2;
    }
  }
  list[uVar4 & 0xffffffff].length = 0xffffffffffffffff;
  return list;
}

Assistant:

EVevent_list
extract_events_from_queue(CManager cm, queue_ptr que, EVevent_list list)
{
    EVevent_list current_entry = NULL;
    queue_item *first = NULL, *last = NULL;
    int num_of_elements = 0;
    
    first = que->queue_head;
    last = que->queue_tail;
                
    while (list[num_of_elements].length != (size_t)-1) num_of_elements++;
    while(first != NULL && last != NULL) {
	list = (EVevent_list) realloc (list, (num_of_elements + 2) * sizeof(list[0]));
	current_entry = &list[num_of_elements];
	if((first->item->event_encoded) || (first->item->ioBuffer != NULL)) {
	    current_entry->length = first->item->event_len;
	    current_entry->buffer = first->item->encoded_event;
	} else {
	    encode_event(cm, first->item);
	    current_entry->length = first->item->event_len;
	    current_entry->buffer = first->item->encoded_event;
	}
	num_of_elements++;
	first = first->next;
    }
    list[num_of_elements].length = (size_t)-1;
    return list;
}